

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

bool __thiscall EOPlus::Context::CheckRules(Context *this)

{
  bool bVar1;
  uint uVar2;
  runtime_error *prVar3;
  deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> *this_00;
  reference pRVar4;
  undefined1 local_2b8 [8];
  Rule rule;
  const_iterator __end2;
  const_iterator __begin2;
  deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> *__range2;
  Context *this_local;
  
  if (this->state == (State *)0x0) {
    if ((this->finished & 1U) == 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"No state selected");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local._7_1_ = 0;
  }
  else {
    if (100 < recursive_depth + 1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Quest action recursion too deep");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = &this->state->rules;
    recursive_depth = recursive_depth + 1;
    std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::begin
              ((const_iterator *)&__end2._M_node,this_00);
    std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::end
              ((const_iterator *)
               &rule.action.expr.args.
                super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,this_00);
    while (bVar1 = std::operator!=((_Self *)&__end2._M_node,
                                   (_Self *)&rule.action.expr.args.
                                             super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                             ._M_impl.super__Deque_impl_data._M_finish._M_node),
          bVar1) {
      pRVar4 = std::_Deque_iterator<EOPlus::Rule,_const_EOPlus::Rule_&,_const_EOPlus::Rule_*>::
               operator*((_Deque_iterator<EOPlus::Rule,_const_EOPlus::Rule_&,_const_EOPlus::Rule_*>
                          *)&__end2._M_node);
      Rule::Rule((Rule *)local_2b8,pRVar4);
      uVar2 = (*this->_vptr_Context[2])(this,local_2b8);
      if (((uVar2 & 1) == 0) ||
         (uVar2 = (*this->_vptr_Context[1])
                            (this,&rule.expr.args.
                                   super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_node),
         (uVar2 & 1) == 0)) {
        bVar1 = false;
      }
      else {
        recursive_depth = recursive_depth + -1;
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      Rule::~Rule((Rule *)local_2b8);
      if (bVar1) goto LAB_0016d54a;
      std::_Deque_iterator<EOPlus::Rule,_const_EOPlus::Rule_&,_const_EOPlus::Rule_*>::operator++
                ((_Deque_iterator<EOPlus::Rule,_const_EOPlus::Rule_&,_const_EOPlus::Rule_*> *)
                 &__end2._M_node);
    }
    recursive_depth = recursive_depth + -1;
    this_local._7_1_ = 0;
  }
LAB_0016d54a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Context::CheckRules()
	{
		if (!this->state)
		{
			if (this->finished)
				return false;
			else
				throw std::runtime_error("No state selected");
		}

		if (++recursive_depth > max_recursion)
		{
			--recursive_depth;
			throw std::runtime_error("Quest action recursion too deep");
		}

		try
		{
			UTIL_FOREACH(this->state->rules, rule)
			{
				if (this->CheckRule(rule.expr))
				{
					if (this->DoAction(rule.action))
					{
						// *this may not be valid here
						--recursive_depth;
						return true;
					}
				}
			}
		}
		catch (...)
		{
			--recursive_depth;
			throw;
		}

		--recursive_depth;

		return false;
	}